

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

void __thiscall Assimp::Ogre::SubMesh::SubMesh(SubMesh *this)

{
  IndexData *this_00;
  SubMesh *this_local;
  
  ISubMesh::ISubMesh(&this->super_ISubMesh);
  this->vertexData = (VertexData *)0x0;
  this_00 = (IndexData *)operator_new(0x20);
  IndexData::IndexData(this_00);
  this->indexData = this_00;
  return;
}

Assistant:

SubMesh::SubMesh() :
    vertexData(0),
    indexData(new IndexData())
{
}